

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

void __thiscall CLI::App::_process(App *this)

{
  FileError *anon_var_0;
  bool in_stack_0000002e;
  bool in_stack_0000002f;
  App *in_stack_00000030;
  App *in_stack_00000040;
  App *in_stack_000000b0;
  App *in_stack_000000d0;
  App *in_stack_00000510;
  
  _process_help_flags(in_stack_00000030,in_stack_0000002f,in_stack_0000002e);
  _process_config_file(in_stack_000000d0);
  _process_env(in_stack_000000b0);
  _process_callbacks(in_stack_00000040);
  _process_requirements(in_stack_00000510);
  return;
}

Assistant:

CLI11_INLINE void App::_process() {
    // help takes precedence over other potential errors and config and environment shouldn't be processed if help
    // throws
    _process_help_flags();
    try {
        // the config file might generate a FileError but that should not be processed until later in the process
        // to allow for help, version and other errors to generate first.
        _process_config_file();

        // process env shouldn't throw but no reason to process it if config generated an error
        _process_env();
    } catch(const CLI::FileError &) {
        // callbacks can generate exceptions which should take priority
        // over the config file error if one exists.
        _process_callbacks();
        throw;
    }

    _process_callbacks();

    _process_requirements();
}